

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket_service.hpp
# Opt level: O1

void __thiscall
asio::datagram_socket_service<asio::ip::udp>::destroy
          (datagram_socket_service<asio::ip::udp> *this,implementation_type *impl)

{
  int descriptor;
  error_code ignored_ec;
  
  descriptor = (impl->super_base_implementation_type).socket_;
  if (descriptor != -1) {
    detail::epoll_reactor::deregister_descriptor
              ((this->service_impl_).super_reactive_socket_service_base.reactor_,descriptor,
               &(impl->super_base_implementation_type).reactor_data_,
               ((impl->super_base_implementation_type).state_ & 0x40) == 0);
    std::_V2::system_category();
    detail::socket_ops::close((impl->super_base_implementation_type).socket_);
  }
  return;
}

Assistant:

void destroy(implementation_type& impl)
  {
    service_impl_.destroy(impl);
  }